

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O3

void __thiscall
irr::core::array<irr::gui::CGUIEnvironment::SSpriteBank>::sort
          (array<irr::gui::CGUIEnvironment::SSpriteBank> *this)

{
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->is_sorted == false) {
    pSVar1 = (this->m_data).
             super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (this->m_data).
             super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar1 != pSVar2) {
      uVar4 = ((long)pSVar2 - (long)pSVar1 >> 3) * -0x71c71c71c71c71c7;
      lVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<irr::gui::CGUIEnvironment::SSpriteBank*,std::vector<irr::gui::CGUIEnvironment::SSpriteBank,std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar1,pSVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<irr::gui::CGUIEnvironment::SSpriteBank*,std::vector<irr::gui::CGUIEnvironment::SSpriteBank,std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar1,pSVar2);
    }
    this->is_sorted = true;
  }
  return;
}

Assistant:

void sort()
	{
		if (!is_sorted) {
			std::sort(m_data.begin(), m_data.end());
			is_sorted = true;
		}
	}